

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

Am_Value Am_Get_Choice_From_Dialog(Am_Value_List *prompt_texts,int x,int y,bool modal)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Method_Wrapper *pAVar3;
  Am_Object *this;
  undefined7 in_register_00000009;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  undefined4 in_register_00000034;
  byte in_R8B;
  Am_Value AVar4;
  Am_Object local_80;
  Am_Object local_78;
  undefined1 local_69;
  Am_Object local_68;
  Am_Object local_60;
  Am_Value_List local_58;
  Am_Object local_48 [3];
  Am_Object local_30;
  Am_Object the_dialog;
  bool modal_local;
  int y_local;
  int x_local;
  Am_Value_List *prompt_texts_local;
  Am_Value *v;
  
  the_dialog.data._7_1_ = in_R8B & 1;
  Am_Object::Am_Object(&local_30);
  bVar1 = Am_Value_List::Empty(&cached_choice_dialogs);
  if (bVar1) {
    Am_Object::Create(local_48,(char *)&Am_Choice_Dialog);
    Am_Object::operator=(&local_30,local_48);
    Am_Object::~Am_Object(local_48);
  }
  else {
    Am_Value_List::Pop(&local_58,true);
    Am_Object::operator=(&local_30,(Am_Value *)&local_58);
    Am_Value::~Am_Value((Am_Value *)&local_58);
  }
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_
                     ((Am_Value_List *)CONCAT44(in_register_00000034,x));
  Am_Object::Set(&local_30,0xa2,pAVar2,0);
  Am_Object::Get_Object(&local_60,(Am_Slot_Key)&local_30,0xc5);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_stop_waiting_for_dialog);
  this = Am_Object::Set(&local_60,0xca,pAVar3,0);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_abort_waiting_for_dialog);
  Am_Object::Set(this,0xc9,pAVar3,0);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Am_Object(&local_68,&local_30);
  Am_Object::Add_Part(&Am_Screen,&local_68,true,0);
  Am_Object::~Am_Object(&local_68);
  set_dialog_position(&local_30,y,(int)CONCAT71(in_register_00000009,modal));
  local_69 = 0;
  Am_Value::Am_Value((Am_Value *)prompt_texts);
  Am_Object::Am_Object(&local_78,&local_30);
  Am_Pop_Up_Window_And_Wait(&local_78,(Am_Value *)prompt_texts,(bool)(the_dialog.data._7_1_ & 1));
  Am_Object::~Am_Object(&local_78);
  Am_Object::Am_Object(&local_80,&local_30);
  Am_Object::Remove_Part(&Am_Screen,&local_80);
  Am_Object::~Am_Object(&local_80);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_30);
  Am_Value_List::Push(&cached_choice_dialogs,pAVar2,true);
  local_69 = 1;
  Am_Object::~Am_Object(&local_30);
  AVar4.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar4._0_8_ = prompt_texts;
  return AVar4;
}

Assistant:

Am_Value
Am_Get_Choice_From_Dialog(Am_Value_List prompt_texts,
                          int x /*= Am_AT_CENTER_SCREEN */,
                          int y /*= Am_AT_CENTER_SCREEN */,
                          bool modal /*=false*/)
{
  Am_Object the_dialog;
  if (cached_choice_dialogs.Empty())
    the_dialog = Am_Choice_Dialog.Create();
  else {
    the_dialog = cached_choice_dialogs.Pop();
  }

  the_dialog.Set(Am_ITEMS, prompt_texts);
  the_dialog.Get_Object(Am_COMMAND)
      .Set(Am_DO_METHOD, do_stop_waiting_for_dialog)
      .Set(Am_ABORT_DO_METHOD, do_abort_waiting_for_dialog);
  Am_Screen.Add_Part(the_dialog);
  set_dialog_position(the_dialog, x, y);
  Am_Value v;
  Am_Pop_Up_Window_And_Wait(the_dialog, v, modal);
  Am_Screen.Remove_Part(the_dialog);
  cached_choice_dialogs.Push(the_dialog);
  return v;
}